

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractContentContext.cpp
# Opt level: O0

EStatusCode __thiscall AbstractContentContext::QuoteLow(AbstractContentContext *this,string *inText)

{
  EStatusCode EVar1;
  allocator<char> local_39;
  string local_38;
  string *local_18;
  string *inText_local;
  AbstractContentContext *this_local;
  
  local_18 = inText;
  inText_local = (string *)this;
  RenewStreamConnectAndStoreResult(this);
  AssertProcsetAvailable(this,&KProcsetPDF_abi_cxx11_);
  AssertProcsetAvailable(this,&KProcsetText_abi_cxx11_);
  PrimitiveObjectsWriter::WriteLiteralString(&this->mPrimitiveWriter,local_18,eTokenSeparatorSpace);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"\'",&local_39);
  PrimitiveObjectsWriter::WriteKeyword(&this->mPrimitiveWriter,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  EVar1 = GetCurrentStatusCode(this);
  return EVar1;
}

Assistant:

EStatusCode AbstractContentContext::QuoteLow(const std::string& inText)
{
	RenewStreamConnectAndStoreResult();
	AssertProcsetAvailable(KProcsetPDF);
	AssertProcsetAvailable(KProcsetText);

	mPrimitiveWriter.WriteLiteralString(inText);
	mPrimitiveWriter.WriteKeyword("'");
	return GetCurrentStatusCode();
}